

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O3

long __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_hash
          (collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  uchar local_21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  do_basic_transform(&local_20,this,level,b,e);
  local_21 = '\0';
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_20,
               (iterator)
               local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_21);
  }
  else {
    *local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = '\0';
    local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  bVar2 = *local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  pbVar1 = local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar2 != 0) {
    do {
      uVar3 = (uint)bVar2 + (int)uVar4 * 0x10;
      uVar3 = uVar3 & 0xfffffff ^ uVar3 >> 0x18 & 0xfffffff0;
      uVar4 = (ulong)uVar3;
      bVar2 = pbVar1[1];
      pbVar1 = pbVar1 + 1;
    } while (bVar2 != 0);
    uVar4 = (ulong)uVar3;
  }
  operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return uVar4;
}

Assistant:

long do_hash(level_type level,CharType const *b,CharType const *e) const
                {
                    std::vector<uint8_t> tmp = do_basic_transform(level,b,e);
                    tmp.push_back(0);
                    return gnu_gettext::pj_winberger_hash_function(reinterpret_cast<char *>(&tmp.front()));
                }